

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeIndexMoveto(BtCursor *pCur,UnpackedRecord *pIdxKey,int *pRes)

{
  byte bVar1;
  MemPage *pMVar2;
  u16 uVar3;
  ushort uVar4;
  int iVar5;
  uint amt;
  RecordCompare xRecordCompare_00;
  byte *pbVar6;
  uchar *pBuf;
  char cVar7;
  int nOverrun;
  u8 *pCellBody;
  void *pCellKey;
  int nCell;
  u8 *pCell;
  MemPage *pPage;
  Pgno chldPg;
  int c_1;
  int idx;
  int upr;
  int lwr;
  int c;
  RecordCompare xRecordCompare;
  int rc;
  int *pRes_local;
  UnpackedRecord *pIdxKey_local;
  BtCursor *pCur_local;
  
  xRecordCompare_00 = sqlite3VdbeFindCompare(pIdxKey);
  pIdxKey->errCode = '\0';
  if (((pCur->eState == '\0') && (pCur->pPage->leaf != '\0')) &&
     (iVar5 = cursorOnLastPage(pCur), iVar5 != 0)) {
    if ((((uint)pCur->ix == pCur->pPage->nCell - 1) &&
        (iVar5 = indexCellCompare(pCur,(uint)pCur->ix,pIdxKey,xRecordCompare_00), iVar5 < 1)) &&
       (pIdxKey->errCode == '\0')) {
      *pRes = iVar5;
      return 0;
    }
    if ((('\0' < pCur->iPage) &&
        (iVar5 = indexCellCompare(pCur,0,pIdxKey,xRecordCompare_00), iVar5 < 1)) &&
       (pIdxKey->errCode == '\0')) {
      pCur->curFlags = pCur->curFlags & 0xfb;
      if (pCur->pPage->isInit == '\0') {
        iVar5 = sqlite3CorruptError(0x12af9);
        return iVar5;
      }
      goto LAB_001602d0;
    }
    pIdxKey->errCode = '\0';
  }
  iVar5 = moveToRoot(pCur);
  if (iVar5 != 0) {
    if (iVar5 != 0x10) {
      return iVar5;
    }
    *pRes = -1;
    return 0;
  }
LAB_001602d0:
  while( true ) {
    pMVar2 = pCur->pPage;
    idx = 0;
    c_1 = pMVar2->nCell - 1;
    iVar5 = c_1;
    while( true ) {
      chldPg = iVar5 >> 1;
      pbVar6 = pMVar2->aDataOfst +
               (int)(uint)(pMVar2->maskPage &
                          CONCAT11(pMVar2->aCellIdx[(int)(chldPg << 1)],
                                   pMVar2->aCellIdx[(long)(int)(chldPg << 1) + 1]));
      bVar1 = *pbVar6;
      uVar3 = (u16)chldPg;
      if ((ushort)pMVar2->max1bytePayload < (ushort)bVar1) {
        if (((pbVar6[1] & 0x80) == 0) &&
           (uVar4 = (bVar1 & 0x7f) * 0x80 + (ushort)pbVar6[1], uVar4 <= pMVar2->maxLocal)) {
          pPage._4_4_ = (*xRecordCompare_00)((int)uVar4,pbVar6 + 2,pIdxKey);
        }
        else {
          (*pMVar2->xParseCell)(pMVar2,pbVar6 + -(long)(int)(uint)pMVar2->childPtrSize,&pCur->info);
          amt = (uint)(pCur->info).nKey;
          if (((int)amt < 2) || (pCur->pBt->nPage < amt / pCur->pBt->usableSize)) {
            xRecordCompare._4_4_ = sqlite3CorruptError(0x12b50);
            goto LAB_00160748;
          }
          pBuf = (uchar *)sqlite3Malloc((long)(int)(amt + 0x12));
          if (pBuf == (uchar *)0x0) {
            xRecordCompare._4_4_ = 7;
            goto LAB_00160748;
          }
          pCur->ix = uVar3;
          xRecordCompare._4_4_ = accessPayload(pCur,0,amt,pBuf,0);
          memset(pBuf + (int)amt,0,0x12);
          pCur->curFlags = pCur->curFlags & 0xfb;
          if (xRecordCompare._4_4_ != 0) {
            sqlite3_free(pBuf);
            goto LAB_00160748;
          }
          pPage._4_4_ = sqlite3VdbeRecordCompare(amt,pBuf,pIdxKey);
          sqlite3_free(pBuf);
        }
      }
      else {
        pPage._4_4_ = (*xRecordCompare_00)((uint)bVar1,pbVar6 + 1,pIdxKey);
      }
      if (pPage._4_4_ < 0) {
        idx = chldPg + 1;
      }
      else {
        if (pPage._4_4_ < 1) {
          *pRes = 0;
          xRecordCompare._4_4_ = 0;
          pCur->ix = uVar3;
          if (pIdxKey->errCode != '\0') {
            xRecordCompare._4_4_ = sqlite3CorruptError(0x12b70);
          }
          goto LAB_00160748;
        }
        c_1 = chldPg - 1;
      }
      if (c_1 < idx) break;
      iVar5 = idx + c_1;
    }
    if (pMVar2->leaf != '\0') break;
    if (idx < (int)(uint)pMVar2->nCell) {
      pPage._0_4_ = sqlite3Get4byte(pMVar2->aData +
                                    (int)(uint)(pMVar2->maskPage &
                                               CONCAT11(pMVar2->aCellIdx[idx << 1],
                                                        pMVar2->aCellIdx[(long)(idx << 1) + 1])));
    }
    else {
      pPage._0_4_ = sqlite3Get4byte(pMVar2->aData + (int)(pMVar2->hdrOffset + 8));
    }
    (pCur->info).nSize = 0;
    pCur->curFlags = pCur->curFlags & 0xf9;
    if ('\x12' < pCur->iPage) {
      iVar5 = sqlite3CorruptError(0x12b8f);
      return iVar5;
    }
    pCur->aiIdx[pCur->iPage] = (u16)idx;
    pCur->apPage[pCur->iPage] = pCur->pPage;
    pCur->ix = 0;
    pCur->iPage = pCur->iPage + '\x01';
    xRecordCompare._4_4_ =
         getAndInitPage(pCur->pBt,(u32)pPage,&pCur->pPage,(uint)pCur->curPagerFlags);
    if ((xRecordCompare._4_4_ == 0) &&
       ((pCur->pPage->nCell == 0 || (pCur->pPage->intKey != pCur->curIntKey)))) {
      releasePage(pCur->pPage);
      xRecordCompare._4_4_ = sqlite3CorruptError(0x12b9a);
    }
    if (xRecordCompare._4_4_ != 0) {
      cVar7 = pCur->iPage + -1;
      pCur->iPage = cVar7;
      pCur->pPage = pCur->apPage[cVar7];
LAB_00160748:
      (pCur->info).nSize = 0;
      return xRecordCompare._4_4_;
    }
  }
  pCur->ix = uVar3;
  *pRes = pPage._4_4_;
  xRecordCompare._4_4_ = 0;
  goto LAB_00160748;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeIndexMoveto(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  int *pRes                /* Write search results here */
){
  int rc;
  RecordCompare xRecordCompare;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( pCur->pKeyInfo!=0 );

#ifdef SQLITE_DEBUG
  pCur->pBtree->nSeek++;   /* Performance measurement during testing */
#endif

  xRecordCompare = sqlite3VdbeFindCompare(pIdxKey);
  pIdxKey->errCode = 0;
  assert( pIdxKey->default_rc==1
       || pIdxKey->default_rc==0
       || pIdxKey->default_rc==-1
  );


  /* Check to see if we can skip a lot of work.  Two cases:
  **
  **    (1) If the cursor is already pointing to the very last cell
  **        in the table and the pIdxKey search key is greater than or
  **        equal to that last cell, then no movement is required.
  **
  **    (2) If the cursor is on the last page of the table and the first
  **        cell on that last page is less than or equal to the pIdxKey
  **        search key, then we can start the search on the current page
  **        without needing to go back to root.
  */
  if( pCur->eState==CURSOR_VALID
   && pCur->pPage->leaf
   && cursorOnLastPage(pCur)
  ){
    int c;
    if( pCur->ix==pCur->pPage->nCell-1
     && (c = indexCellCompare(pCur, pCur->ix, pIdxKey, xRecordCompare))<=0
     && pIdxKey->errCode==SQLITE_OK
    ){
      *pRes = c;
      return SQLITE_OK;  /* Cursor already pointing at the correct spot */
    }
    if( pCur->iPage>0
     && indexCellCompare(pCur, 0, pIdxKey, xRecordCompare)<=0
     && pIdxKey->errCode==SQLITE_OK
    ){
      pCur->curFlags &= ~BTCF_ValidOvfl;
      if( !pCur->pPage->isInit ){
        return SQLITE_CORRUPT_BKPT;
      }
      goto bypass_moveto_root;  /* Start search on the current page */
    }
    pIdxKey->errCode = SQLITE_OK;
  }

  rc = moveToRoot(pCur);
  if( rc ){
    if( rc==SQLITE_EMPTY ){
      assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
      *pRes = -1;
      return SQLITE_OK;
    }
    return rc;
  }

bypass_moveto_root:
  assert( pCur->pPage );
  assert( pCur->pPage->isInit );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->pPage->nCell > 0 );
  assert( pCur->curIntKey==0 );
  assert( pIdxKey!=0 );
  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->pPage;
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==0 );
    lwr = 0;
    upr = pPage->nCell-1;
    idx = upr>>1; /* idx = (lwr+upr)/2; */
    for(;;){
      int nCell;  /* Size of the pCell cell in bytes */
      pCell = findCellPastPtr(pPage, idx);

      /* The maximum supported page-size is 65536 bytes. This means that
      ** the maximum number of record bytes stored on an index B-Tree
      ** page is less than 16384 bytes and may be stored as a 2-byte
      ** varint. This information is used to attempt to avoid parsing
      ** the entire cell by checking for the cases where the record is
      ** stored entirely within the b-tree page by inspecting the first
      ** 2 bytes of the cell.
      */
      nCell = pCell[0];
      if( nCell<=pPage->max1bytePayload ){
        /* This branch runs if the record-size field of the cell is a
        ** single byte varint and the record fits entirely on the main
        ** b-tree page.  */
        testcase( pCell+nCell+1==pPage->aDataEnd );
        c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
      }else if( !(pCell[1] & 0x80)
        && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
      ){
        /* The record-size field is a 2 byte varint and the record
        ** fits entirely on the main b-tree page.  */
        testcase( pCell+nCell+2==pPage->aDataEnd );
        c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
      }else{
        /* The record flows over onto one or more overflow pages. In
        ** this case the whole cell needs to be parsed, a buffer allocated
        ** and accessPayload() used to retrieve the record into the
        ** buffer before VdbeRecordCompare() can be called.
        **
        ** If the record is corrupt, the xRecordCompare routine may read
        ** up to two varints past the end of the buffer. An extra 18
        ** bytes of padding is allocated at the end of the buffer in
        ** case this happens.  */
        void *pCellKey;
        u8 * const pCellBody = pCell - pPage->childPtrSize;
        const int nOverrun = 18;  /* Size of the overrun padding */
        pPage->xParseCell(pPage, pCellBody, &pCur->info);
        nCell = (int)pCur->info.nKey;
        testcase( nCell<0 );   /* True if key size is 2^32 or more */
        testcase( nCell==0 );  /* Invalid key size:  0x80 0x80 0x00 */
        testcase( nCell==1 );  /* Invalid key size:  0x80 0x80 0x01 */
        testcase( nCell==2 );  /* Minimum legal index key size */
        if( nCell<2 || nCell/pCur->pBt->usableSize>pCur->pBt->nPage ){
          rc = SQLITE_CORRUPT_PAGE(pPage);
          goto moveto_index_finish;
        }
        pCellKey = sqlite3Malloc( nCell+nOverrun );
        if( pCellKey==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto moveto_index_finish;
        }
        pCur->ix = (u16)idx;
        rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
        memset(((u8*)pCellKey)+nCell,0,nOverrun); /* Fix uninit warnings */
        pCur->curFlags &= ~BTCF_ValidOvfl;
        if( rc ){
          sqlite3_free(pCellKey);
          goto moveto_index_finish;
        }
        c = sqlite3VdbeRecordCompare(nCell, pCellKey, pIdxKey);
        sqlite3_free(pCellKey);
      }
      assert(
          (pIdxKey->errCode!=SQLITE_CORRUPT || c==0)
       && (pIdxKey->errCode!=SQLITE_NOMEM || pCur->pBtree->db->mallocFailed)
      );
      if( c<0 ){
        lwr = idx+1;
      }else if( c>0 ){
        upr = idx-1;
      }else{
        assert( c==0 );
        *pRes = 0;
        rc = SQLITE_OK;
        pCur->ix = (u16)idx;
        if( pIdxKey->errCode ) rc = SQLITE_CORRUPT_BKPT;
        goto moveto_index_finish;
      }
      if( lwr>upr ) break;
      assert( lwr+upr>=0 );
      idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2 */
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->pPage->nCell || CORRUPT_DB );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_index_finish;
    }
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }

    /* This block is similar to an in-lined version of:
    **
    **    pCur->ix = (u16)lwr;
    **    rc = moveToChild(pCur, chldPg);
    **    if( rc ) break;
    */
    pCur->info.nSize = 0;
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
    if( pCur->iPage>=(BTCURSOR_MAX_DEPTH-1) ){
      return SQLITE_CORRUPT_BKPT;
    }
    pCur->aiIdx[pCur->iPage] = (u16)lwr;
    pCur->apPage[pCur->iPage] = pCur->pPage;
    pCur->ix = 0;
    pCur->iPage++;
    rc = getAndInitPage(pCur->pBt, chldPg, &pCur->pPage, pCur->curPagerFlags);
    if( rc==SQLITE_OK
     && (pCur->pPage->nCell<1 || pCur->pPage->intKey!=pCur->curIntKey)
    ){
      releasePage(pCur->pPage);
      rc = SQLITE_CORRUPT_PGNO(chldPg);
    }
    if( rc ){
      pCur->pPage = pCur->apPage[--pCur->iPage];
      break;
    }
    /*
    ***** End of in-lined moveToChild() call */
 }
moveto_index_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}